

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_sampler.cc
# Opt level: O0

void __thiscall quic::BandwidthSampler::EnableOverestimateAvoidance(BandwidthSampler *this)

{
  BandwidthSampler *this_local;
  
  if ((this->overestimate_avoidance_ & 1U) == 0) {
    this->overestimate_avoidance_ = true;
    MaxAckHeightTracker::SetAckAggregationBandwidthThreshold(&this->max_ack_height_tracker_,2.0);
  }
  return;
}

Assistant:

void BandwidthSampler::EnableOverestimateAvoidance() {
  if (overestimate_avoidance_) {
    return;
  }

  overestimate_avoidance_ = true;
  // TODO(wub): Change the default value of
  // --quic_ack_aggregation_bandwidth_threshold to 2.0.
  max_ack_height_tracker_.SetAckAggregationBandwidthThreshold(2.0);
}